

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSyncTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::Sync::FlushCommandsTest::iterate(FlushCommandsTest *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_500;
  MessageBuilder local_4f0;
  MessageBuilder local_370;
  long local_1f0;
  MessageBuilder local_1e8;
  int local_64;
  uint *puStack_60;
  GLenum wait_result;
  GLuint *data_dst;
  deUint32 local_44;
  long lStack_40;
  GLenum error;
  GLsync sync;
  GLuint buffer_dst;
  GLuint buffer_src;
  bool is_timeout;
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  FlushCommandsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  _is_timeout = (*pRVar3->_vptr_RenderContext[2])();
  buffer_src = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)_is_timeout,(ApiType)buffer_src);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  buffer_dst._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)buffer_dst._3_1_)) {
    buffer_dst._2_1_ = 0;
    buffer_dst._1_1_ = 0;
    buffer_dst._0_1_ = 0;
    sync._4_4_ = 0;
    sync._0_4_ = 0;
    lStack_40 = 0;
    local_44 = 0;
    (**(code **)(lStack_20 + 0x3b8))(1,(long)&sync + 4);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glCreateBuffers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0x79);
    (**(code **)(lStack_20 + 0xec0))(sync._4_4_,8,iterate::reference,0x88e6);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glNamedBufferData have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0x7b);
    (**(code **)(lStack_20 + 0x3b8))(1,&sync);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glCreateBuffers have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0x7e);
    (**(code **)(lStack_20 + 0xed8))((int)sync,8,0,0xc1);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glNamedBufferStorage have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0x81);
    puStack_60 = (uint *)(**(code **)(lStack_20 + 0xd10))((int)sync,0,8,0xc1);
    dVar2 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar2,"glMapNamedBufferRange have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0x86);
    (**(code **)(lStack_20 + 0x340))(sync._4_4_,(int)sync,0,0,8);
    local_44 = (**(code **)(lStack_20 + 0x800))();
    if (local_44 != 0) {
      (**(code **)(lStack_20 + 0x1678))((int)sync);
      glu::checkError(local_44,"glCopyNamedBufferSubData have failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                      ,0x8f);
    }
    lStack_40 = (**(code **)(lStack_20 + 0x640))(0x9117,0);
    local_44 = (**(code **)(lStack_20 + 0x800))();
    if (local_44 == 0) {
      local_64 = (**(code **)(lStack_20 + 0x228))(lStack_40,1,16000000000);
      local_44 = (**(code **)(lStack_20 + 0x800))();
      if (local_44 == 0) {
        if (local_64 == 0x911b) {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<(&local_1e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (&local_1e8,
                              (char (*) [85])
                              "ClientWaitSync with SYNC_FLUSH_COMMANDS_BIT flag has returned TIMEOUT_EXPIRED after "
                             );
          local_1f0 = 16000000000;
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f0);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [122])
                                     " nanoseconds. Potentially test may not be done in finite time which is expected (OpenGL 4.5 Core Profile, Chapter 4.1.2)."
                             );
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,(char (*) [62])
                                     " However this cannot be proven in finite time. Test timeouts."
                             );
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_1e8);
          buffer_dst._0_1_ = 1;
        }
        else if ((local_64 == 0x911c) || (local_64 == 0x911a)) {
          if ((*puStack_60 == 3) || (puStack_60[1] == 0x159af7)) {
            buffer_dst._2_1_ = 1;
          }
          else {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<(&local_370,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<(&local_370,(char (*) [14])"Result data [");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,puStack_60);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,puStack_60 + 1);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,(char (*) [32])"is not equal to the reference [");
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,iterate::reference);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a3caab);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,iterate::reference + 1);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])"]. Tests fails.");
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_370);
          }
        }
      }
      else {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<(&local_4f0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_4f0,(char (*) [45])"ClientWaitSync unexpectedly generated error "
                           );
        EVar7 = glu::getErrorStr(local_44);
        local_500.m_getName = EVar7.m_getName;
        local_500.m_value = EVar7.m_value;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_500);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])0x2a4b1ae);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4f0);
      }
    }
    (**(code **)(lStack_20 + 0x1678))((int)sync);
    glu::checkError(local_44,"glUnmapNamedBuffer have failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSyncTests.cpp"
                    ,0xc3);
    if (sync._4_4_ != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
    }
    if ((int)sync != 0) {
      (**(code **)(lStack_20 + 0x438))(1);
    }
    if (lStack_40 != 0) {
      (**(code **)(lStack_20 + 0x478))(lStack_40);
    }
    if (((byte)buffer_dst & 1) == 0) {
      if ((buffer_dst._2_1_ & 1) == 0) {
        if ((buffer_dst._1_1_ & 1) == 0) {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
        }
        else {
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_INTERNAL_ERROR,"Error");
        }
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_TIMEOUT,
                 "Timeout (Potentially, ClientWaitSync with SYNC_FLUSH_COMMANDS does not return in finite time)."
                );
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FlushCommandsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok		= false;
	bool is_error   = false;
	bool is_timeout = false;

	/* Test constants. */
	static const glw::GLuint reference[2]   = { 3, 1415927 };
	static const glw::GLuint reference_size = sizeof(reference);

	/* Test objects. */
	glw::GLuint buffer_src = 0;
	glw::GLuint buffer_dst = 0;
	glw::GLsync sync	   = 0;
	glw::GLenum error	  = GL_NO_ERROR;

	try
	{
		/* Prepare buffers. */
		gl.createBuffers(1, &buffer_src);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers have failed");
		gl.namedBufferData(buffer_src, reference_size, reference, GL_STATIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData have failed");

		gl.createBuffers(1, &buffer_dst);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers have failed");
		gl.namedBufferStorage(buffer_dst, reference_size, NULL,
							  GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferStorage have failed");

		/* Map perisistently buffer range. */
		glw::GLuint* data_dst = (glw::GLuint*)gl.mapNamedBufferRange(
			buffer_dst, 0, reference_size, GL_MAP_READ_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBufferRange have failed");

		/* Copy data from source to destination buffer */
		gl.copyNamedBufferSubData(buffer_src, buffer_dst, 0, 0, reference_size);

		if (GL_NO_ERROR != (error = gl.getError()))
		{
			gl.unmapNamedBuffer(buffer_dst);

			GLU_EXPECT_NO_ERROR(error, "glCopyNamedBufferSubData have failed");
		}

		/* Create fence sync object. */
		sync = gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);

		if (GL_NO_ERROR == (error = gl.getError()))
		{
			/* Wait until done. */
			glw::GLenum wait_result = gl.clientWaitSync(sync, GL_SYNC_FLUSH_COMMANDS_BIT, TEST_SYNC_WAIT_TIMEOUT);

			/* Check for error. */
			if (GL_NO_ERROR == (error = gl.getError()))
			{
				/* Check for timeout. */
				if (GL_TIMEOUT_EXPIRED == wait_result)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message
						<< "ClientWaitSync with SYNC_FLUSH_COMMANDS_BIT flag has returned TIMEOUT_EXPIRED after "
						<< TEST_SYNC_WAIT_TIMEOUT << " nanoseconds. Potentially test may not be done in finite time "
													 "which is expected (OpenGL 4.5 Core Profile, Chapter 4.1.2)."
						<< " However this cannot be proven in finite time. Test timeouts." << tcu::TestLog::EndMessage;

					is_timeout = true;
				} /* Check for proper wait result. */
				else if ((GL_CONDITION_SATISFIED == wait_result) || (GL_ALREADY_SIGNALED == wait_result))
				{
					/* Compare destination buffer data with reference. */
					if ((reference[0] == data_dst[0]) || (reference[1] == data_dst[1]))
					{
						is_ok = true;
					}
					else
					{
						m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result data [" << data_dst[0]
															<< ", " << data_dst[1] << "is not equal to the reference ["
															<< reference[0] << ", " << reference[1] << "]. Tests fails."
															<< tcu::TestLog::EndMessage;
					}
				}
			}
			else
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "ClientWaitSync unexpectedly generated error "
					<< glu::getErrorStr(error) << ". Tests fails." << tcu::TestLog::EndMessage;
			}
		}

		/* Unmapping. */
		gl.unmapNamedBuffer(buffer_dst);
		GLU_EXPECT_NO_ERROR(error, "glUnmapNamedBuffer have failed");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (buffer_src)
	{
		gl.deleteBuffers(1, &buffer_src);
	}

	if (buffer_dst)
	{
		gl.deleteBuffers(1, &buffer_dst);
	}

	if (sync)
	{
		gl.deleteSync(sync);
	}

	/* Result's setup. */
	if (is_timeout)
	{
		m_testCtx.setTestResult(
			QP_TEST_RESULT_TIMEOUT,
			"Timeout (Potentially, ClientWaitSync with SYNC_FLUSH_COMMANDS does not return in finite time).");
	}
	else
	{
		if (is_ok)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
		{
			if (is_error)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			}
		}
	}

	return STOP;
}